

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::ServiceGenerator::GenerateImplementation
          (ServiceGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  io::Printer::Print(printer,&this->vars_,
                     "$classname$::~$classname$() {}\n\nconst ::google::protobuf::ServiceDescriptor* $classname$::descriptor() {\n  protobuf_AssignDescriptorsOnce();\n  return $classname$_descriptor_;\n}\n\nconst ::google::protobuf::ServiceDescriptor* $classname$::GetDescriptor() {\n  protobuf_AssignDescriptorsOnce();\n  return $classname$_descriptor_;\n}\n\n"
                    );
  GenerateNotImplementedMethods(this,printer);
  GenerateCallMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  io::Printer::Print(printer,&this->vars_,
                     "$classname$_Stub::$classname$_Stub(::google::protobuf::rpc::Caller* client)\n  : client_(client), owns_client_(false) {}\n$classname$_Stub::$classname$_Stub(\n    ::google::protobuf::rpc::Caller* client, bool client_ownership)\n  : client_(client),\n    owns_client_(client_ownership) {}\n$classname$_Stub::~$classname$_Stub() {\n  if (owns_client_) delete client_;\n}\n\n"
                    );
  GenerateStubMethods(this,printer);
  return;
}

Assistant:

void ServiceGenerator::GenerateImplementation(io::Printer* printer) {
  printer->Print(vars_,
    "$classname$::~$classname$() {}\n"
    "\n"
    "const ::google::protobuf::ServiceDescriptor* $classname$::descriptor() {\n"
    "  protobuf_AssignDescriptorsOnce();\n"
    "  return $classname$_descriptor_;\n"
    "}\n"
    "\n"
    "const ::google::protobuf::ServiceDescriptor* $classname$::GetDescriptor() {\n"
    "  protobuf_AssignDescriptorsOnce();\n"
    "  return $classname$_descriptor_;\n"
    "}\n"
    "\n");

  // Generate methods of the interface.
  GenerateNotImplementedMethods(printer);
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);

  // Generate stub implementation.
  printer->Print(vars_,
    "$classname$_Stub::$classname$_Stub(::google::protobuf::rpc::Caller* client)\n"
    "  : client_(client), owns_client_(false) {}\n"
    "$classname$_Stub::$classname$_Stub(\n"
    "    ::google::protobuf::rpc::Caller* client, bool client_ownership)\n"
    "  : client_(client),\n"
    "    owns_client_(client_ownership) {}\n"
    "$classname$_Stub::~$classname$_Stub() {\n"
    "  if (owns_client_) delete client_;\n"
    "}\n"
    "\n");

  GenerateStubMethods(printer);
}